

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O2

optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
* hmi::anon_unknown_0::translate_event
            (optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
             *__return_storage_ptr__,Uint32 window_id,SDL_Event *event)

{
  Uint8 UVar1;
  Uint32 UVar2;
  mouse_button mVar3;
  keyboard_modifiers kVar4;
  
  UVar2 = event->type;
  switch(UVar2) {
  case 0x400:
    if ((event->motion).which == 0xffffffff) goto switchD_00103835_caseD_7;
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
      ._M_payload = *(undefined8 *)((long)&(event->user).data1 + 4);
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
             ._M_payload + 0xc) = 9;
    break;
  case 0x401:
    if ((event->edit).text[5] != '\x01') {
      __assert_fail("event.button.state == SDL_PRESSED",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/window.cc"
                    ,0x141,
                    "std::optional<window_event> hmi::(anonymous namespace)::translate_event(Uint32, const SDL_Event &)"
                   );
    }
    if ((event->motion).which == 0xffffffff) goto switchD_00103835_caseD_7;
    mVar3 = compute_mouse_button((event->button).button);
    *(mouse_button *)
     &(__return_storage_ptr__->
      super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
      ._M_payload = mVar3;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
             ._M_payload + 4) = *(undefined8 *)((long)&(event->user).data1 + 4);
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
             ._M_payload + 0xc) = 7;
    break;
  case 0x402:
    if ((event->edit).text[5] != '\0') {
      __assert_fail("event.button.state == SDL_RELEASED",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/window.cc"
                    ,0x14f,
                    "std::optional<window_event> hmi::(anonymous namespace)::translate_event(Uint32, const SDL_Event &)"
                   );
    }
    if ((event->motion).which == 0xffffffff) goto switchD_00103835_caseD_7;
    mVar3 = compute_mouse_button((event->button).button);
    *(mouse_button *)
     &(__return_storage_ptr__->
      super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
      ._M_payload = mVar3;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
             ._M_payload + 4) = *(undefined8 *)((long)&(event->user).data1 + 4);
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
             ._M_payload + 0xc) = 8;
    break;
  case 0x403:
    if ((event->motion).which == 0xffffffff) goto switchD_00103835_caseD_7;
    *(void **)&(__return_storage_ptr__->
               super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
               ._M_payload = (event->user).data1;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
             ._M_payload + 0xc) = 10;
    break;
  default:
    if (UVar2 == 0x100) {
switchD_00103835_caseD_e:
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
               ._M_payload + 0xc) = 1;
      (__return_storage_ptr__->
      super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
      ._M_engaged = true;
      return __return_storage_ptr__;
    }
    if (UVar2 == 0x301) {
      if ((event->display).event != '\0') {
        __assert_fail("event.key.state == SDL_RELEASED",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/window.cc"
                      ,0x12d,
                      "std::optional<window_event> hmi::(anonymous namespace)::translate_event(Uint32, const SDL_Event &)"
                     );
      }
      kVar4 = compute_keyboard_modifiers((event->key).keysym.mod);
      *(ulong *)&(__return_storage_ptr__->
                 super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                 ._M_payload =
           CONCAT44((int)(event->tfinger).fingerId,(int)((ulong)(event->tfinger).fingerId >> 0x20));
      *(keyboard_modifiers *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
               ._M_payload + 8) = kVar4;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
               ._M_payload + 0xc) = 6;
    }
    else if (UVar2 == 0x300) {
      if ((event->display).event != '\x01') {
        __assert_fail("event.key.state == SDL_PRESSED",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/window.cc"
                      ,0x11a,
                      "std::optional<window_event> hmi::(anonymous namespace)::translate_event(Uint32, const SDL_Event &)"
                     );
      }
      UVar1 = (event->display).padding1;
      kVar4 = compute_keyboard_modifiers((event->key).keysym.mod);
      *(ulong *)&(__return_storage_ptr__->
                 super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                 ._M_payload =
           CONCAT44((int)(event->tfinger).fingerId,(int)((ulong)(event->tfinger).fingerId >> 0x20));
      *(keyboard_modifiers *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
               ._M_payload + 8) = kVar4;
      if (UVar1 == '\0') {
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                 ._M_payload + 0xc) = 4;
      }
      else {
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                 ._M_payload + 0xc) = 5;
      }
    }
    else {
      if ((UVar2 != 0x200) || ((event->display).display != window_id)) {
switchD_00103835_caseD_7:
        (__return_storage_ptr__->
        super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
        ._M_engaged = false;
        return __return_storage_ptr__;
      }
      switch((event->display).event) {
      case '\x06':
        *(void **)&(__return_storage_ptr__->
                   super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                   )._M_payload.
                   super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                   ._M_payload = (event->user).data1;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                 ._M_payload + 0xc) = 0;
        break;
      default:
        goto switchD_00103835_caseD_7;
      case '\n':
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                 ._M_payload + 0xc) = 0xb;
        break;
      case '\v':
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                 ._M_payload + 0xc) = 0xc;
        break;
      case '\f':
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                 ._M_payload + 0xc) = 2;
        break;
      case '\r':
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                 ._M_payload + 0xc) = 3;
        break;
      case '\x0e':
        goto switchD_00103835_caseD_e;
      }
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
  )._M_payload.
  super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
  ._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

std::optional<window_event> translate_event(Uint32 window_id, const SDL_Event& event) {
      switch (event.type) {
        case SDL_WINDOWEVENT:
          if (window_id != event.window.windowID) {
            return std::nullopt;
          }

          switch (event.window.event) {
            case SDL_WINDOWEVENT_SIZE_CHANGED: {
              window_events::resized data;
              data.size.width = event.window.data1;
              data.size.height = event.window.data2;
              return data;
            }

            case SDL_WINDOWEVENT_CLOSE:
              return window_events::closed{};

            case SDL_WINDOWEVENT_FOCUS_GAINED:
              return window_events::focus_gained{};

            case SDL_WINDOWEVENT_FOCUS_LOST:
              return window_events::focus_lost{};

            case SDL_WINDOWEVENT_ENTER:
              return window_events::mouse_entered{};

            case SDL_WINDOWEVENT_LEAVE:
              return window_events::mouse_left{};

            default:
              return std::nullopt;
          }
          break;

        case SDL_QUIT:
          return window_events::closed{};

        case SDL_KEYDOWN:
          assert(event.key.state == SDL_PRESSED);

          if (event.key.repeat == 0) {
            window_events::keyboard_key_pressed data;
            data.keycode = static_cast<keyboard_keycode>(event.key.keysym.sym);
            data.scancode = static_cast<keyboard_scancode>(event.key.keysym.scancode);
            data.modifiers = compute_keyboard_modifiers(event.key.keysym.mod);
            return data;
          } else {
            window_events::keyboard_key_repeated data;
            data.keycode = static_cast<keyboard_keycode>(event.key.keysym.sym);
            data.scancode = static_cast<keyboard_scancode>(event.key.keysym.scancode);
            data.modifiers = compute_keyboard_modifiers(event.key.keysym.mod);
            return data;
          }

          break;

        case SDL_KEYUP: {
          assert(event.key.state == SDL_RELEASED);
          window_events::keyboard_key_released data;
          data.keycode = static_cast<keyboard_keycode>(event.key.keysym.sym);
          data.scancode = static_cast<keyboard_scancode>(event.key.keysym.scancode);
          data.modifiers = compute_keyboard_modifiers(event.key.keysym.mod);
          return data;
        }

        case SDL_MOUSEWHEEL: {
          if (event.wheel.which == SDL_TOUCH_MOUSEID) {
            return std::nullopt;
          }

          window_events::mouse_wheel_scrolled data;
          data.offset.x = event.wheel.x;
          data.offset.y = event.wheel.y;
          return data;
        }

        case SDL_MOUSEBUTTONDOWN: {
          assert(event.button.state == SDL_PRESSED);

          if (event.button.which == SDL_TOUCH_MOUSEID) {
            return std::nullopt;
          }

          window_events::mouse_button_pressed data;
          data.button = compute_mouse_button(event.button.button);
          data.position.x = event.button.x;
          data.position.y = event.button.y;
          return data;
        }

        case SDL_MOUSEBUTTONUP: {
          assert(event.button.state == SDL_RELEASED);

          if (event.button.which == SDL_TOUCH_MOUSEID) {
            return std::nullopt;
          }

          window_events::mouse_button_released data;
          data.button = compute_mouse_button(event.button.button);
          data.position.x = event.button.x;
          data.position.y = event.button.y;
          return data;
        }

        case SDL_MOUSEMOTION: {
          if (event.motion.which == SDL_TOUCH_MOUSEID) {
            return std::nullopt;
          }

          window_events::mouse_moved data;
          data.position.x = event.motion.x;
          data.position.y = event.motion.y;
          return data;
        }

        default:
          break;
      }

      return std::nullopt;
    }